

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O2

void fuzzBytes(BuilderContext *ctx)

{
  RandomGenerator *this;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_type sVar3;
  result_type_conflict rVar4;
  result_type_conflict rVar5;
  Buffer<unsigned_char> *this_00;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  string vpackBytes;
  
  this = &ctx->randomGenerator;
  iVar7 = 10;
  do {
    bVar8 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar8) {
      return;
    }
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(&this->mt64);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(&this->mt64);
    this_00 = arangodb::velocypack::Builder::bufferRef(&ctx->builder);
    arangodb::velocypack::Buffer<unsigned_char>::toString_abi_cxx11_(&vpackBytes,this_00);
    sVar3 = vpackBytes._M_string_length;
    if (vpackBytes._M_string_length == 0) {
      uVar6 = 0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = rVar5;
      uVar6 = (ulong)(0x18 < vpackBytes._M_string_length) << 3;
      if (SUB168(auVar1 % ZEXT816(3),0) == 2) {
        rVar5 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        uVar6 = rVar5 % (uVar6 | 1) + sVar3 + ~uVar6;
      }
      else if (SUB164(auVar1 % ZEXT816(3),0) == 1) {
        rVar5 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        uVar6 = rVar5 % sVar3;
      }
      else {
        rVar5 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        uVar6 = rVar5 % (uVar6 | 1);
      }
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = rVar4;
    if (SUB168(auVar2 % ZEXT816(3),0) == 0) {
      if (vpackBytes._M_string_length != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&vpackBytes,uVar6,1);
        goto LAB_00104638;
      }
    }
    else {
      if (SUB164(auVar2 % ZEXT816(3),0) == 1) {
        if (vpackBytes._M_string_length == 0) goto LAB_00104651;
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        vpackBytes._M_dataplus._M_p[uVar6] = (char)rVar4;
      }
      else {
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(&this->mt64);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (&vpackBytes,uVar6,1,(char)rVar4);
      }
LAB_00104638:
      arangodb::velocypack::Buffer<unsigned_char>::clear(this_00);
      arangodb::velocypack::Buffer<unsigned_char>::append<unsigned_char>
                (this_00,(uchar *)vpackBytes._M_dataplus._M_p,vpackBytes._M_string_length);
    }
LAB_00104651:
    std::__cxx11::string::~string((string *)&vpackBytes);
  } while( true );
}

Assistant:

static void fuzzBytes(BuilderContext& ctx) {
  using limits = KnownLimitValues;
  for (uint32_t i = 0; i < limits::numFuzzIterations; ++i) {
    FuzzActions fuzzAction = static_cast<FuzzActions>(
        ctx.randomGenerator.mt64() % FuzzActions::NUM_OPTIONS_ACTIONS);
    FuzzBytes fuzzByte = static_cast<FuzzBytes>(ctx.randomGenerator.mt64() %
                                                FuzzBytes::NUM_OPTIONS_BYTES);
    auto& builderBuffer = ctx.builder.bufferRef();
    std::string vpackBytes = builderBuffer.toString();
    size_t bytePos = getBytePos(ctx, fuzzByte, vpackBytes);
    switch (fuzzAction) {
      case REMOVE_BYTE:
        if (vpackBytes.empty()) {
          continue;
        }
        vpackBytes.erase(bytePos, 1);
        break;
      case REPLACE_BYTE:
        if (vpackBytes.empty()) {
          continue;
        }
        vpackBytes[bytePos] =
            generateRandWithinRange<uint8_t>(0, 255, ctx.randomGenerator);
        break;
      case INSERT_BYTE:
        vpackBytes.insert(
            bytePos, 1,
            static_cast<std::string::value_type>(
                generateRandWithinRange<uint8_t>(0, 255, ctx.randomGenerator)));
        break;
      default:
        VELOCYPACK_ASSERT(false);
    }
    builderBuffer.clear();
    builderBuffer.append(reinterpret_cast<uint8_t const*>(vpackBytes.data()),
                         vpackBytes.size());
  }
}